

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf,void *bignum,size_t size)

{
  int iVar1;
  uint64_t uVar2;
  size_t sVar3;
  long lVar4;
  size_t len;
  size_t sVar5;
  char *in_RCX;
  st_ptls_key_schedule_t *sched;
  uint uVar6;
  char *src;
  ptls_buffer_t *buf_00;
  undefined2 uVar7;
  undefined4 in_R8D;
  ulong uVar8;
  ulong uVar9;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  size_t sStack_88;
  size_t sStack_80;
  uint uStack_74;
  ulong uStack_70;
  ptls_buffer_t *ppStack_68;
  size_t sStack_60;
  size_t sStack_58;
  char *pcStack_50;
  size_t sStack_48;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  
  uVar7 = (undefined2)((uint)in_R8D >> 8);
  uVar8 = (long)size >> 0x3f & size;
  for (; (uVar9 = uVar8, 0 < (long)size && (uVar9 = size, *bignum == '\0'));
      bignum = (void *)((long)bignum + 1)) {
    size = size - 1;
  }
  local_29 = 2;
  iVar1 = ptls_buffer__do_pushv(buf,&local_29,1);
  if (iVar1 == 0) {
    local_2a = 0xff;
    iVar1 = ptls_buffer__do_pushv(buf,&local_2a,1);
    if (iVar1 == 0) {
      sVar3 = buf->off;
      if (*bignum < '\0') {
        local_2b = 0;
        iVar1 = ptls_buffer__do_pushv(buf,&local_2b,1);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      sVar5 = uVar9;
      src = (char *)bignum;
      if (size == 0) {
        sVar5 = 1;
        src = "";
      }
      buf_00 = buf;
      iVar1 = ptls_buffer__do_pushv(buf,src,sVar5);
      if (iVar1 == 0) {
        uVar8 = buf->off - sVar3;
        if (0x7f < uVar8) {
          ptls_buffer__adjust_asn1_blocksize(buf_00,(size_t)src);
          ppStack_68 = buf;
          sStack_60 = size;
          sStack_58 = sVar3;
          pcStack_50 = (char *)bignum;
          sStack_48 = uVar9;
          iVar1 = ptls_buffer__do_pushv(buf_00,"",2);
          if (iVar1 == 0) {
            sVar3 = buf_00->off;
            uVar2 = gettime_millis();
            uStack_70 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                        (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                        (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                        (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
            iVar1 = ptls_buffer__do_pushv(buf_00,&uStack_70,8);
            if ((iVar1 == 0) &&
               (sStack_80 = sVar3, iVar1 = ptls_buffer__do_pushv(buf_00,"",2), iVar1 == 0)) {
              sVar3 = buf_00->off;
              iVar1 = ptls_buffer_reserve(buf_00,sched->algo->digest_size);
              if ((iVar1 == 0) &&
                 (sStack_88 = sVar3,
                 iVar1 = derive_resumption_secret(sched,buf_00->base + buf_00->off), iVar1 == 0)) {
                sVar3 = buf_00->off + sched->algo->digest_size;
                buf_00->off = sVar3;
                lVar4 = sVar3 - sStack_88;
                buf_00->base[sStack_88 - 2] = (uint8_t)((ulong)lVar4 >> 8);
                buf_00->base[sStack_88 - 1] = (uint8_t)lVar4;
                uStack_8a = (undefined1)((ushort)uVar7 >> 8);
                uStack_89 = (undefined1)uVar7;
                iVar1 = ptls_buffer__do_pushv(buf_00,&uStack_8a,2);
                if (iVar1 == 0) {
                  uVar6 = (uint)src;
                  uStack_74 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                              uVar6 << 0x18;
                  iVar1 = ptls_buffer__do_pushv(buf_00,&uStack_74,4);
                  if ((iVar1 == 0) && (iVar1 = ptls_buffer__do_pushv(buf_00,"",2), iVar1 == 0)) {
                    sVar3 = buf_00->off;
                    sVar5 = sVar3;
                    if (in_RCX != (char *)0x0) {
                      len = strlen(in_RCX);
                      iVar1 = ptls_buffer__do_pushv(buf_00,in_RCX,len);
                      if (iVar1 != 0) {
                        return iVar1;
                      }
                      sVar5 = buf_00->off;
                    }
                    buf_00->base[sVar3 - 2] = (uint8_t)(sVar5 - sVar3 >> 8);
                    buf_00->base[sVar3 - 1] = (uint8_t)(sVar5 - sVar3);
                    lVar4 = buf_00->off - sStack_80;
                    buf_00->base[sStack_80 - 2] = (uint8_t)((ulong)lVar4 >> 8);
                    buf_00->base[sStack_80 - 1] = (uint8_t)lVar4;
                    iVar1 = 0;
                  }
                }
              }
            }
          }
          return iVar1;
        }
        buf->base[sVar3 - 1] = (uint8_t)uVar8;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf, const void *bignum, size_t size)
{
    const uint8_t *p = bignum, *end = p + size;
    int ret;

    /* skip zeroes */
    for (; end - p >= 1; ++p)
        if (*p != 0)
            break;

    /* emit */
    ptls_buffer_push(buf, 2);
    ptls_buffer_push_asn1_block(buf, {
        if (*p >= 0x80)
            ptls_buffer_push(buf, 0);
        if (p != end) {
            ptls_buffer_pushv(buf, p, end - p);
        } else {
            ptls_buffer_pushv(buf, "", 1);
        }
    });
    ret = 0;

Exit:
    return ret;
}